

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

PackageSymbol * __thiscall
slang::ast::Compilation::getPackage(Compilation *this,string_view lookupName)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  size_t __n;
  char *__s1;
  int iVar10;
  uint64_t uVar11;
  PackageSymbol *pPVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  value_type_pointer ppVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  size_t local_40;
  char *local_38;
  
  local_38 = lookupName._M_str;
  local_40 = lookupName._M_len;
  uVar11 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->packageMap,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_40);
  __s1 = local_38;
  __n = local_40;
  uVar14 = uVar11 >> ((byte)(this->packageMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar2 = (this->packageMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
           .arrays.groups_;
  lVar15 = (uVar11 & 0xff) * 4;
  uVar6 = (&UNK_0046cabc)[lVar15];
  uVar7 = (&UNK_0046cabd)[lVar15];
  uVar8 = (&UNK_0046cabe)[lVar15];
  uVar9 = (&UNK_0046cabf)[lVar15];
  ppVar3 = (this->packageMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
           .arrays.elements_;
  uVar4 = (this->packageMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
          .arrays.groups_size_mask;
  uVar16 = 0;
  do {
    pgVar1 = pgVar2 + uVar14;
    auVar19[0] = -(pgVar1->m[0].n == uVar6);
    auVar19[1] = -(pgVar1->m[1].n == uVar7);
    auVar19[2] = -(pgVar1->m[2].n == uVar8);
    auVar19[3] = -(pgVar1->m[3].n == uVar9);
    auVar19[4] = -(pgVar1->m[4].n == uVar6);
    auVar19[5] = -(pgVar1->m[5].n == uVar7);
    auVar19[6] = -(pgVar1->m[6].n == uVar8);
    auVar19[7] = -(pgVar1->m[7].n == uVar9);
    auVar19[8] = -(pgVar1->m[8].n == uVar6);
    auVar19[9] = -(pgVar1->m[9].n == uVar7);
    auVar19[10] = -(pgVar1->m[10].n == uVar8);
    auVar19[0xb] = -(pgVar1->m[0xb].n == uVar9);
    auVar19[0xc] = -(pgVar1->m[0xc].n == uVar6);
    auVar19[0xd] = -(pgVar1->m[0xd].n == uVar7);
    auVar19[0xe] = -(pgVar1->m[0xe].n == uVar8);
    auVar19[0xf] = -(pgVar1->m[0xf].n == uVar9);
    uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    if (uVar13 != 0) {
      do {
        uVar5 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        bVar18 = __n == ppVar3[uVar14 * 0xf + (ulong)uVar5].first._M_len;
        ppVar17 = ppVar3 + uVar14 * 0xf + (ulong)uVar5;
        if (bVar18 && __n != 0) {
          iVar10 = bcmp(__s1,(ppVar17->first)._M_str,__n);
          bVar18 = iVar10 == 0;
        }
        if (bVar18) goto LAB_0013dc62;
        uVar13 = uVar13 - 1 & uVar13;
      } while (uVar13 != 0);
      ppVar17 = (value_type_pointer)&local_40;
      if (bVar18) goto LAB_0013dc62;
    }
    if ((pgVar2[uVar14].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7]) == 0) break;
    lVar15 = uVar14 + uVar16;
    uVar16 = uVar16 + 1;
    uVar14 = lVar15 + 1U & uVar4;
  } while (uVar16 <= uVar4);
  ppVar17 = (value_type_pointer)0x0;
LAB_0013dc62:
  if (ppVar17 == (value_type_pointer)0x0) {
    pPVar12 = (PackageSymbol *)0x0;
  }
  else {
    pPVar12 = ppVar17->second;
  }
  return pPVar12;
}

Assistant:

const PackageSymbol* Compilation::getPackage(std::string_view lookupName) const {
    auto it = packageMap.find(lookupName);
    if (it == packageMap.end())
        return nullptr;
    return it->second;
}